

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

realtype LBasis(ARKInterp I,int j,realtype t)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  realtype rVar5;
  
  uVar3 = (ulong)*(int *)((long)I->content + 0x18);
  if ((long)uVar3 < 1) {
    rVar5 = 1.0;
  }
  else {
    rVar5 = 1.0;
    uVar4 = 0;
    do {
      if ((uint)j != uVar4) {
        lVar2 = *(long *)((long)I->content + 0x10);
        dVar1 = *(double *)(lVar2 + uVar4 * 8);
        rVar5 = rVar5 * ((t - dVar1) / (*(double *)(lVar2 + (long)j * 8) - dVar1));
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return rVar5;
}

Assistant:

realtype LBasis(ARKInterp I, int j, realtype t)
{
  int k;
  realtype p = ONE;
  for (k=0; k<LINT_NHIST(I); k++) {
    if (k == j) continue;
    p *= (t-LINT_TJ(I,k))/(LINT_TJ(I,j)-LINT_TJ(I,k));
  }
  return(p);
}